

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O3

void __thiscall
psy::C::TagDeclarationSymbol::TagDeclarationSymbol
          (TagDeclarationSymbol *this,SymbolKind symK,Symbol *containingSym,SyntaxTree *tree,
          Scope *enclosingScope,TagType *tagTy)

{
  TypeDeclarationImpl *p;
  undefined7 in_register_00000031;
  
  p = (TypeDeclarationImpl *)operator_new(0x30);
  (p->super_DeclarationImpl).super_SymbolImpl.containingSym_ = containingSym;
  (p->super_DeclarationImpl).tree_ = tree;
  (p->super_DeclarationImpl).enclosingScope_ = enclosingScope;
  (p->super_DeclarationImpl).denotedTy_ = (Type *)0x0;
  *(ushort *)&(p->super_DeclarationImpl).super_SymbolImpl.field_1 =
       (ushort)CONCAT71(in_register_00000031,symK) | 0x100;
  p->ty_ = &tagTy->super_Type;
  TypeDeclarationSymbol::TypeDeclarationSymbol(&this->super_TypeDeclarationSymbol,p);
  (this->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol._vptr_Symbol =
       (_func_int **)&PTR__TagDeclarationSymbol_00520640;
  (this->membDecls_).
  super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->membDecls_).
  super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->membDecls_).
  super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TagType::setDeclaration(tagTy,this);
  return;
}

Assistant:

TagDeclarationSymbol::TagDeclarationSymbol(
        SymbolKind symK,
        const Symbol* containingSym,
        const SyntaxTree* tree,
        const Scope* enclosingScope,
        TagType* tagTy)
    : TypeDeclarationSymbol(
          new TypeDeclarationImpl(symK,
                                  containingSym,
                                  tree,
                                  enclosingScope,
                                  NameSpace::Tags,
                                  tagTy))
{
    tagTy->setDeclaration(this);
}